

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O1

bool __thiscall ON_BrepLoop::Read(ON_BrepLoop *this,ON_BinaryArchive *file)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  int i;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = (uint)CONCAT71(in_register_00000001,in_AL);
  bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_loop_index);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_ti);
  }
  uStack_18 = (ulong)(uint)uStack_18;
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)((long)&uStack_18 + 4));
  }
  if (uStack_18._4_4_ < crvonsrf) {
    this->m_type = uStack_18._4_4_;
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_fi);
  }
  return bVar1;
}

Assistant:

bool ON_BrepLoop::Read( ON_BinaryArchive& file )
{
  int i;
  bool rc = file.ReadInt( & m_loop_index );
  if (rc)
    rc = file.ReadArray( m_ti );

  i = unknown;
  if (rc)
    rc = file.ReadInt( &i );
  switch(i) {
  case unknown:
    m_type = unknown;
    break;
  case outer:
    m_type = outer;
    break;
  case inner:
    m_type = inner;
    break;
  case slit:
    m_type = slit;
    break;
  }

  if (rc)
    rc = file.ReadInt( &m_fi );
  return rc;
}